

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O2

int Abc_NtkCombinePos(Abc_Ntk_t *pNtk,int fAnd,int fXor)

{
  Abc_Aig_t *pMan;
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pFanin;
  int iVar3;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                  ,0x486,"int Abc_NtkCombinePos(Abc_Ntk_t *, int, int)");
  }
  iVar3 = 1;
  if (pNtk->vPos->nSize != 1) {
    pAVar2 = Abc_AigConst1(pNtk);
    pFanin = (Abc_Obj_t *)((ulong)pAVar2 ^ 1);
    if (fAnd != 0) {
      pFanin = pAVar2;
    }
    for (iVar3 = 0; iVar1 = pNtk->vPos->nSize, iVar3 < iVar1; iVar3 = iVar3 + 1) {
      pAVar2 = Abc_NtkPo(pNtk,iVar3);
      pMan = (Abc_Aig_t *)pNtk->pManFunc;
      pAVar2 = Abc_ObjChild0(pAVar2);
      if (fAnd == 0) {
        if (fXor == 0) {
          pFanin = Abc_AigOr(pMan,pFanin,pAVar2);
        }
        else {
          pFanin = Abc_AigXor(pMan,pFanin,pAVar2);
        }
      }
      else {
        pFanin = Abc_AigAnd(pMan,pFanin,pAVar2);
      }
    }
    while (0 < iVar1) {
      iVar1 = iVar1 + -1;
      pAVar2 = Abc_NtkPo(pNtk,iVar1);
      Abc_NtkDeleteObj(pAVar2);
    }
    if (pNtk->vPos->nSize != 0) {
      __assert_fail("Abc_NtkPoNum(pNtk) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                    ,0x49a,"int Abc_NtkCombinePos(Abc_Ntk_t *, int, int)");
    }
    pAVar2 = Abc_NtkCreatePo(pNtk);
    Abc_ObjAddFanin(pAVar2,pFanin);
    Abc_ObjAssignName(pAVar2,"miter",(char *)0x0);
    Abc_NtkOrderCisCos(pNtk);
    iVar1 = Abc_NtkCheck(pNtk);
    iVar3 = 1;
    if (iVar1 == 0) {
      puts("Abc_NtkOrPos: The network check has failed.");
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int Abc_NtkCombinePos( Abc_Ntk_t * pNtk, int fAnd, int fXor )
{
    Abc_Obj_t * pNode, * pMiter;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
//    assert( Abc_NtkLatchNum(pNtk) == 0 );
    if ( Abc_NtkPoNum(pNtk) == 1 )
        return 1;
    // start the result
    if ( fAnd )
        pMiter = Abc_AigConst1(pNtk);
    else
        pMiter = Abc_ObjNot( Abc_AigConst1(pNtk) );
    // perform operations on the POs
    Abc_NtkForEachPo( pNtk, pNode, i )
        if ( fAnd )
            pMiter = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, pMiter, Abc_ObjChild0(pNode) );
        else if ( fXor )
            pMiter = Abc_AigXor( (Abc_Aig_t *)pNtk->pManFunc, pMiter, Abc_ObjChild0(pNode) );
        else
            pMiter = Abc_AigOr( (Abc_Aig_t *)pNtk->pManFunc, pMiter, Abc_ObjChild0(pNode) );
    // remove the POs and their names
    for ( i = Abc_NtkPoNum(pNtk) - 1; i >= 0; i-- )
        Abc_NtkDeleteObj( Abc_NtkPo(pNtk, i) );
    assert( Abc_NtkPoNum(pNtk) == 0 );
    // create the new PO
    pNode = Abc_NtkCreatePo( pNtk );
    Abc_ObjAddFanin( pNode, pMiter );
    Abc_ObjAssignName( pNode, "miter", NULL );
    Abc_NtkOrderCisCos( pNtk );
    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkOrPos: The network check has failed.\n" );
        return 0;
    }
    return 1;
}